

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O0

void periodic_recalc(ev_loop *loop,ev_periodic *w)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double local_38;
  ev_tstamp nat;
  ev_tstamp at;
  ev_tstamp interval;
  ev_periodic *w_local;
  ev_loop *loop_local;
  
  if (w->interval <= 0.0001220703125) {
    local_38 = 0.0001220703125;
  }
  else {
    local_38 = w->interval;
  }
  dVar3 = w->offset;
  dVar2 = floor((loop->ev_rt_now - w->offset) / local_38);
  nat = local_38 * dVar2 + dVar3;
  do {
    if (loop->ev_rt_now < nat) goto LAB_0010a541;
    dVar3 = nat + w->interval;
    bVar1 = dVar3 != nat;
    nat = dVar3;
  } while (bVar1);
  nat = loop->ev_rt_now;
LAB_0010a541:
  w->at = nat;
  return;
}

Assistant:

static void noinline
periodic_recalc (EV_P_ ev_periodic *w)
{
  ev_tstamp interval = w->interval > MIN_INTERVAL ? w->interval : MIN_INTERVAL;
  ev_tstamp at = w->offset + interval * ev_floor ((ev_rt_now - w->offset) / interval);

  /* the above almost always errs on the low side */
  while (at <= ev_rt_now)
    {
      ev_tstamp nat = at + w->interval;

      /* when resolution fails us, we use ev_rt_now */
      if (expect_false (nat == at))
        {
          at = ev_rt_now;
          break;
        }

      at = nat;
    }

  ev_at (w) = at;
}